

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk2dfd.c
# Opt level: O0

uint32_t * vk2dfd(VkFormat format)

{
  int in_EDI;
  int bits_45 [4];
  int channels_45 [4];
  int bits_44 [4];
  int channels_44 [4];
  int bits_43 [4];
  int channels_43 [4];
  int position_ys_7 [4];
  int position_xs_7 [4];
  int shiftBits_13 [4];
  int bits_42 [4];
  int channels_42 [4];
  int position_ys_6 [4];
  int position_xs_6 [4];
  int shiftBits_12 [4];
  int bits_41 [4];
  int channels_41 [4];
  int position_ys_5 [4];
  int position_xs_5 [4];
  int shiftBits_11 [4];
  int bits_40 [4];
  int channels_40 [4];
  int position_ys_4 [4];
  int position_xs_4 [4];
  int shiftBits_10 [4];
  int bits_39 [4];
  int channels_39 [4];
  int shiftBits_9 [4];
  int bits_38 [4];
  int channels_38 [4];
  int shiftBits_8 [2];
  int bits_37 [2];
  int channels_37 [2];
  int shiftBits_7 [1];
  int bits_36 [1];
  int channels_36 [1];
  int position_ys_3 [4];
  int position_xs_3 [4];
  int shiftBits_6 [4];
  int bits_35 [4];
  int channels_35 [4];
  int position_ys_2 [4];
  int position_xs_2 [4];
  int shiftBits_5 [4];
  int bits_34 [4];
  int channels_34 [4];
  int shiftBits_4 [4];
  int bits_33 [4];
  int channels_33 [4];
  int shiftBits_3 [2];
  int bits_32 [2];
  int channels_32 [2];
  int shiftBits_2 [1];
  int bits_31 [1];
  int channels_31 [1];
  int position_ys_1 [4];
  int position_xs_1 [4];
  int shiftBits_1 [4];
  int bits_30 [4];
  int channels_30 [4];
  int position_ys [4];
  int position_xs [4];
  int shiftBits [4];
  int bits_29 [4];
  int channels_29 [4];
  int channels_28 [1];
  int bits_28 [1];
  int bits_27 [3];
  int channels_27 [3];
  int bits_26 [4];
  int channels_26 [4];
  int bits_25 [4];
  int channels_25 [4];
  int bits_24 [4];
  int channels_24 [4];
  int bits_23 [4];
  int channels_23 [4];
  int bits_22 [4];
  int channels_22 [4];
  int bits_21 [4];
  int channels_21 [4];
  int bits_20 [4];
  int channels_20 [4];
  int bits_19 [4];
  int channels_19 [4];
  int bits_18 [4];
  int channels_18 [4];
  int bits_17 [4];
  int channels_17 [4];
  int bits_16 [4];
  int channels_16 [4];
  int bits_15 [4];
  int channels_15 [4];
  int bits_14 [4];
  int channels_14 [4];
  int bits_13 [4];
  int channels_13 [4];
  int bits_12 [4];
  int channels_12 [4];
  int bits_11 [4];
  int channels_11 [4];
  int bits_10 [4];
  int channels_10 [4];
  int bits_9 [4];
  int channels_9 [4];
  int bits_8 [4];
  int channels_8 [4];
  int bits_7 [4];
  int channels_7 [4];
  int bits_6 [4];
  int channels_6 [4];
  int bits_5 [4];
  int channels_5 [4];
  int bits_4 [3];
  int channels_4 [3];
  int bits_3 [3];
  int channels_3 [3];
  int bits_2 [4];
  int channels_2 [4];
  int bits_1 [4];
  int channels_1 [4];
  int bits [2];
  int channels [2];
  VkSuffix in_stack_fffffffffffff8dc;
  undefined4 in_stack_fffffffffffff8e0;
  int iVar1;
  int *in_stack_fffffffffffff8e8;
  VkSuffix suffix;
  int numChannels;
  int *in_stack_fffffffffffff8f0;
  VkSuffix suffix_00;
  int redBlueSwap;
  int *in_stack_fffffffffffff8f8;
  int bytes;
  int numChannels_00;
  int *in_stack_fffffffffffff900;
  VkSuffix suffix_01;
  int *in_stack_fffffffffffff908;
  int bheight;
  int bwidth;
  undefined8 in_stack_fffffffffffff910;
  VkCompScheme compScheme;
  int *in_stack_fffffffffffff920;
  VkSuffix in_stack_fffffffffffff928;
  undefined1 local_698 [16];
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 in_stack_fffffffffffff9a0;
  VkSuffix suffix_02;
  int *in_stack_fffffffffffff9a8;
  int *in_stack_fffffffffffff9b0;
  int *in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  undefined1 local_51c [4];
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_43c;
  undefined8 local_434;
  undefined8 local_42c;
  undefined4 local_424;
  undefined4 local_420;
  undefined1 local_41c [4];
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined1 local_378 [4];
  undefined1 local_374 [4];
  undefined8 local_370;
  undefined4 local_368;
  undefined8 local_364;
  undefined4 local_35c;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  undefined4 local_84;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_1c;
  undefined8 local_14;
  uint32_t *local_8;
  
  suffix_02 = (VkSuffix)((ulong)in_stack_fffffffffffff9a0 >> 0x20);
  numChannels = (int)in_stack_fffffffffffff8f0;
  suffix_00 = (VkSuffix)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
  if (in_EDI == 1) {
    local_14 = 1;
    local_1c = 0x400000004;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(1,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 2) {
    local_38 = 0x200000003;
    local_30 = 1;
    local_48 = 0x400000004;
    local_40 = 0x400000004;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(2,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 3) {
    local_58 = 3;
    local_50 = 0x200000001;
    local_68 = 0x400000004;
    local_60 = 0x400000004;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(3,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 4) {
    local_74 = 0x100000002;
    local_6c = 0;
    local_80 = 0x600000005;
    local_78 = 5;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(4,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 5) {
    local_8c = 0x100000000;
    local_84 = 2;
    local_98 = 0x600000005;
    local_90 = 5;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(5,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 6) {
    local_a8 = 0x200000003;
    local_a0 = 1;
    local_b8 = 0x500000001;
    local_b0 = 0x500000005;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(6,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 7) {
    local_c8 = 3;
    local_c0 = 0x200000001;
    local_d8 = 0x500000001;
    local_d0 = 0x500000005;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(7,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else if (in_EDI == 8) {
    local_e8 = 0x100000002;
    local_e0 = 0x300000000;
    local_f8 = 0x500000005;
    local_f0 = 0x100000005;
    local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                              (int *)CONCAT44(8,in_stack_fffffffffffff8e0),in_stack_fffffffffffff8dc
                             );
  }
  else {
    redBlueSwap = (int)in_stack_fffffffffffff8f8;
    bytes = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
    numChannels_00 = (int)in_stack_fffffffffffff900;
    suffix_01 = (VkSuffix)((ulong)in_stack_fffffffffffff900 >> 0x20);
    if (in_EDI == 9) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 10) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0xb) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0xc) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0xd) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0xe) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0xf) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x10) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x11) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x12) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x13) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x14) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x15) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x16) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x17) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x18) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x19) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1a) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1b) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1c) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1d) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1e) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x1f) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x20) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x21) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x22) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x23) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x24) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x25) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x26) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x27) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x28) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x29) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2a) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2b) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2c) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2d) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2e) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x2f) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x30) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x31) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x32) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x33) {
      local_108 = 0x100000000;
      local_100 = 0x300000002;
      local_118 = 0x800000008;
      local_110 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x33,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x34) {
      local_128 = 0x100000000;
      local_120 = 0x300000002;
      local_138 = 0x800000008;
      local_130 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x34,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x35) {
      local_148 = 0x100000000;
      local_140 = 0x300000002;
      local_158 = 0x800000008;
      local_150 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x35,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x36) {
      local_168 = 0x100000000;
      local_160 = 0x300000002;
      local_178 = 0x800000008;
      local_170 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x36,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x37) {
      local_188 = 0x100000000;
      local_180 = 0x300000002;
      local_198 = 0x800000008;
      local_190 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x37,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x38) {
      local_1a8 = 0x100000000;
      local_1a0 = 0x300000002;
      local_1b8 = 0x800000008;
      local_1b0 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x38,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x39) {
      local_1c8 = 0x100000000;
      local_1c0 = 0x300000002;
      local_1d8 = 0x800000008;
      local_1d0 = 0x800000008;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x39,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3a) {
      local_1e8 = 0x100000002;
      local_1e0 = 0x300000000;
      local_1f8 = 0xa0000000a;
      local_1f0 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3a,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3b) {
      local_208 = 0x100000002;
      local_200 = 0x300000000;
      local_218 = 0xa0000000a;
      local_210 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3b,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3c) {
      local_228 = 0x100000002;
      local_220 = 0x300000000;
      local_238 = 0xa0000000a;
      local_230 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3c,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3d) {
      local_248 = 0x100000002;
      local_240 = 0x300000000;
      local_258 = 0xa0000000a;
      local_250 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3d,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3e) {
      local_268 = 0x100000002;
      local_260 = 0x300000000;
      local_278 = 0xa0000000a;
      local_270 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3e,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x3f) {
      local_288 = 0x100000002;
      local_280 = 0x300000000;
      local_298 = 0xa0000000a;
      local_290 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x3f,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x40) {
      local_2a8 = 0x100000000;
      local_2a0 = 0x300000002;
      local_2b8 = 0xa0000000a;
      local_2b0 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x40,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x41) {
      local_2c8 = 0x100000000;
      local_2c0 = 0x300000002;
      local_2d8 = 0xa0000000a;
      local_2d0 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x41,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x42) {
      local_2e8 = 0x100000000;
      local_2e0 = 0x300000002;
      local_2f8 = 0xa0000000a;
      local_2f0 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x42,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x43) {
      local_308 = 0x100000000;
      local_300 = 0x300000002;
      local_318 = 0xa0000000a;
      local_310 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x43,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x44) {
      local_328 = 0x100000000;
      local_320 = 0x300000002;
      local_338 = 0xa0000000a;
      local_330 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x44,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x45) {
      local_348 = 0x100000000;
      local_340 = 0x300000002;
      local_358 = 0xa0000000a;
      local_350 = 0x20000000a;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x45,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x46) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x47) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x48) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x49) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4a) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4b) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4c) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4d) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4e) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x4f) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x50) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x51) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x52) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x53) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x54) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x55) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x56) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x57) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x58) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x59) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5a) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5b) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5c) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5d) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5e) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x5f) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x60) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x61) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x62) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 99) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 100) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x65) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x66) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x67) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x68) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x69) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6a) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6b) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6c) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6d) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6e) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x6f) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x70) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x71) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x72) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x73) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x74) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x75) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x76) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x77) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x78) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x79) {
      local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
    }
    else if (in_EDI == 0x7a) {
      local_364 = 0x100000000;
      local_35c = 2;
      local_370 = 0xb0000000b;
      local_368 = 10;
      local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(0x7a,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else if (in_EDI == 0x7b) {
      memset(local_374,0,4);
      memset(local_378,0,4);
      local_8 = createDFDPacked((int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                                (int)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                (int *)CONCAT44(in_EDI,in_stack_fffffffffffff8e0),
                                in_stack_fffffffffffff8dc);
    }
    else {
      iVar1 = (int)in_stack_fffffffffffff8e8;
      suffix = (VkSuffix)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
      if (in_EDI == 0x7c) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x7c);
      }
      else if (in_EDI == 0x7d) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x7d);
      }
      else if (in_EDI == 0x7e) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x7e);
      }
      else if (in_EDI == 0x7f) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x7f);
      }
      else if (in_EDI == 0x80) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x80);
      }
      else if (in_EDI == 0x81) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x81);
      }
      else if (in_EDI == 0x82) {
        local_8 = createDFDDepthStencil(suffix,iVar1,0x82);
      }
      else {
        iVar1 = (int)in_stack_fffffffffffff908;
        bheight = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
        bwidth = (int)in_stack_fffffffffffff910;
        compScheme = (VkCompScheme)((ulong)in_stack_fffffffffffff910 >> 0x20);
        if (in_EDI == 0x83) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x84) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x85) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x86) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x87) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x88) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x89) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8a) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8b) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8c) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8d) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8e) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x8f) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x90) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x91) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x92) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x93) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x94) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x95) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x96) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x97) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x98) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x99) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9a) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9b) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9c) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9d) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9e) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x9f) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa0) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa1) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa2) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa3) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa4) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa5) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa6) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa7) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa8) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xa9) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xaa) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xab) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xac) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xad) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xae) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xaf) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb0) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb1) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb2) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb3) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb4) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb5) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb6) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb7) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0xb8) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf0) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf1) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf2) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf3) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf4) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf5) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf6) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9b9cf7) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd0) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd1) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd2) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd3) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd4) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd5) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd6) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd7) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd8) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbd9) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbda) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbdb) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbdc) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9bcbdd) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9d2b60) {
          local_388 = 0x100000000;
          local_380 = 0x200000000;
          local_398 = 0x800000008;
          local_390 = 0x800000008;
          memset(local_3a8,0,0x10);
          local_3b8 = 0x4000000040;
          local_3b0 = 0x40000000c0;
          local_3c8 = 0x8000000080;
          local_3c0 = 0x8000000080;
          local_8 = createDFD422((int)((ulong)in_stack_fffffffffffff910 >> 0x20),
                                 (int)in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b61) {
          local_3d8 = 1;
          local_3d0 = 2;
          local_3e8 = 0x800000008;
          local_3e0 = 0x800000008;
          memset(local_3f8,0,0x10);
          local_408 = 0x4000000040;
          local_400 = 0xc000000040;
          local_418 = 0x8000000080;
          local_410 = 0x8000000080;
          local_8 = createDFD422((int)((ulong)in_stack_fffffffffffff910 >> 0x20),
                                 (int)in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b67) {
          memset(local_41c,0,4);
          local_420 = 10;
          local_424 = 6;
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b68) {
          local_42c = 0x100000000;
          local_434 = 0xa0000000a;
          local_43c = 0x600000006;
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b69) {
          local_458 = 0x100000000;
          local_450 = 0x300000002;
          local_468 = 0xa0000000a;
          local_460 = 0xa0000000a;
          local_478 = 0x600000006;
          local_470 = 0x600000006;
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b6a) {
          local_488 = 0x100000000;
          local_480 = 0x200000000;
          local_498 = 0xa0000000a;
          local_490 = 0xa0000000a;
          local_4a8 = 0x600000006;
          local_4a0 = 0x600000006;
          local_4b8 = 0x4000000040;
          local_4b0 = 0x40000000c0;
          local_4c8 = 0x8000000080;
          local_4c0 = 0x8000000080;
          local_8 = createDFD422(compScheme,bwidth,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b6b) {
          local_4d8 = 1;
          local_4d0 = 2;
          local_4e8 = 0xa0000000a;
          local_4e0 = 0xa0000000a;
          local_4f8 = 0x600000006;
          local_4f0 = 0x600000006;
          local_508 = 0x4000000040;
          local_500 = 0xc000000040;
          local_518 = 0x8000000080;
          local_510 = 0x8000000080;
          local_8 = createDFD422(compScheme,bwidth,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b71) {
          memset(local_51c,0,4);
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b72) {
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b73) {
          local_8 = createDFDPackedShifted
                              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                               in_stack_fffffffffffff9a8,suffix_02);
        }
        else if (in_EDI == 0x3b9d2b74) {
          local_8 = createDFD422(compScheme,bwidth,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b75) {
          local_8 = createDFD422(compScheme,bwidth,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b7b) {
          memset(&stack0xfffffffffffff9b8,0,0x10);
          local_668 = 0x8000000080;
          local_8 = createDFD422((int)((ulong)in_stack_fffffffffffff910 >> 0x20),
                                 (int)in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9d2b7c) {
          local_678 = 1;
          local_670 = 2;
          local_688 = 0x1000000010;
          local_680 = 0x1000000010;
          memset(local_698,0,0x10);
          local_8 = createDFD422((int)((ulong)in_stack_fffffffffffff910 >> 0x20),
                                 (int)in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                                 in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                                 in_stack_fffffffffffff8f0,in_stack_fffffffffffff920,
                                 in_stack_fffffffffffff928);
        }
        else if (in_EDI == 0x3b9f2f00) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f01) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f02) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f03) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f04) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f05) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f06) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f07) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f08) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f09) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0a) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0b) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0c) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0d) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0e) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f0f) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f10) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f11) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f12) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f13) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f14) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f15) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f16) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f17) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f18) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f19) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f1a) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f1b) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f1c) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9f2f1d) {
          local_8 = createDFDCompressed(compScheme,bwidth,bheight,iVar1,suffix_01);
        }
        else if (in_EDI == 0x3b9ffa20) {
          local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                    (int *)CONCAT44(0x3b9ffa20,in_stack_fffffffffffff8e0),
                                    in_stack_fffffffffffff8dc);
        }
        else if (in_EDI == 0x3b9ffa21) {
          local_8 = createDFDPacked(suffix_00,numChannels,in_stack_fffffffffffff8e8,
                                    (int *)CONCAT44(0x3b9ffa21,in_stack_fffffffffffff8e0),
                                    in_stack_fffffffffffff8dc);
        }
        else if (in_EDI == 0x3ba1de80) {
          local_8 = createDFDUnpacked(suffix_01,numChannels_00,bytes,redBlueSwap,suffix_00);
        }
        else if (in_EDI == 0x3ba1f5f0) {
          local_8 = createDFDPacked(1,5,(int *)0x500000005,
                                    (int *)CONCAT44(0x3ba1f5f0,in_stack_fffffffffffff8e0),
                                    in_stack_fffffffffffff8dc);
        }
        else if (in_EDI == 0x3ba1f5f1) {
          local_8 = createDFDAlpha(suffix_00,numChannels,suffix);
        }
        else {
          local_8 = (uint32_t *)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

uint32_t*
vk2dfd(enum VkFormat format)
 {
     switch (format) {
#include "vk2dfd.inl"
         default: return 0;
     }
 }